

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformMatrixOrderCaseBlockContentCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedBasicTypeCases,bool opaqueCases)

{
  deInt32 *pdVar1;
  MatrixOrder MVar2;
  ProgramInterface PVar3;
  TestNode *node;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  TestNode *pTVar6;
  long lVar7;
  int expandLevel;
  SharedPtr subStructure;
  ProgramResourceQueryTestTarget queryTarget;
  Layout layout;
  undefined4 uStack_5c;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&queryTarget,PROGRAMINTERFACE_UNIFORM,0x40);
  lVar7 = 8;
  do {
    MVar2 = *(MatrixOrder *)
             ((long)&generateUniformMatrixOrderCaseBlockContentCases::qualifiers[0].name + lVar7);
    if ((MVar2 == MATRIXORDER_LAST) || (parentStructure->m_ptr->m_type == TYPE_INTERFACE_BLOCK)) {
      subStructure.m_ptr = parentStructure->m_ptr;
      subStructure.m_state = parentStructure->m_state;
      if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (subStructure.m_state)->strongRefCount = (subStructure.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (subStructure.m_state)->weakRefCount = (subStructure.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,context->m_testCtx,*(char **)(&UNK_00b52ae8 + lVar7),
                 SSBOArrayLengthTests::init::arraysSized + 1);
      tcu::TestNode::addChild(&targetGroup->super_TestNode,node);
      if (MVar2 != MATRIXORDER_LAST) {
        glu::Layout::Layout(&layout,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
        layout.matrixOrder = MVar2;
        pNVar4 = (Node *)operator_new(0x38);
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
        pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
        (pNVar4->m_enclosingNode).m_ptr = subStructure.m_ptr;
        (pNVar4->m_enclosingNode).m_state = subStructure.m_state;
        if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          (subStructure.m_state)->strongRefCount = (subStructure.m_state)->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b52a10;
        pNVar4[1]._vptr_Node = (_func_int **)layout._0_8_;
        pNVar4[1].m_type = layout.offset;
        *(FormatLayout *)&pNVar4[1].field_0xc = layout.format;
        *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = layout.matrixOrder;
        pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar5->strongRefCount = 0;
        pSVar5->weakRefCount = 0;
        pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
        pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
        pSVar5->strongRefCount = 1;
        pSVar5->weakRefCount = 1;
        if (subStructure.m_state != pSVar5) {
          if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &(subStructure.m_state)->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              subStructure.m_ptr = (Node *)0x0;
              (*(subStructure.m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &(subStructure.m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if ((*pdVar1 == 0) && (subStructure.m_state != (SharedPtrStateBase *)0x0)) {
              (*(subStructure.m_state)->_vptr_SharedPtrStateBase[1])();
            }
          }
          LOCK();
          pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pSVar5->weakRefCount = pSVar5->weakRefCount + 1;
          UNLOCK();
          subStructure.m_ptr = pNVar4;
          subStructure.m_state = pSVar5;
        }
        LOCK();
        pdVar1 = &pSVar5->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*pSVar5->_vptr_SharedPtrStateBase[2])(pSVar5);
        }
        LOCK();
        pdVar1 = &pSVar5->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (*pSVar5->_vptr_SharedPtrStateBase[1])(pSVar5);
        }
      }
      PVar3 = queryTarget.interface;
      if (MVar2 == MATRIXORDER_LAST && extendedBasicTypeCases) {
        pTVar6 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar6,context->m_testCtx,"types",
                   SSBOArrayLengthTests::init::arraysSized + 1);
        tcu::TestNode::addChild(node,pTVar6);
        expandLevel = 0;
        generateVariableCases(context,&subStructure,(TestCaseGroup *)pTVar6,&queryTarget,1,false);
        generateMatrixVariableCases
                  (context,&subStructure,(TestCaseGroup *)pTVar6,&queryTarget,false,expandLevel);
        if (opaqueCases) {
          generateOpaqueTypeCases
                    (context,&subStructure,(TestCaseGroup *)pTVar6,&queryTarget,2,false);
        }
        pTVar6 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar6,context->m_testCtx,"aggregates",
                   SSBOArrayLengthTests::init::arraysSized + 1);
        tcu::TestNode::addChild(node,pTVar6);
        PVar3 = queryTarget.interface;
        layout._0_8_ = &layout.matrixOrder;
        std::__cxx11::string::_M_construct<char_const*>((string *)&layout,0x98644f);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)pTVar6,PVar3,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      else {
        layout._0_8_ = &layout.matrixOrder;
        std::__cxx11::string::_M_construct<char_const*>((string *)&layout,0x98644f);
        generateBufferBackedVariableAggregateTypeCases
                  (context,&subStructure,(TestCaseGroup *)node,PVar3,
                   PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR,TYPE_FLOAT_MAT3X2,(string *)&layout,1);
      }
      if ((MatrixOrder *)layout._0_8_ != &layout.matrixOrder) {
        operator_delete((void *)layout._0_8_,CONCAT44(uStack_5c,layout.matrixOrder) + 1);
      }
      if (subStructure.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(subStructure.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          subStructure.m_ptr = (Node *)0x0;
          (*(subStructure.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(subStructure.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (subStructure.m_state != (SharedPtrStateBase *)0x0)) {
          (*(subStructure.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x38);
  return;
}

Assistant:

static void generateUniformMatrixOrderCaseBlockContentCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, bool extendedBasicTypeCases, bool opaqueCases)
{
	static const struct
	{
		const char*			name;
		glu::MatrixOrder	order;
	} qualifiers[] =
	{
		{ "no_qualifier",	glu::MATRIXORDER_LAST			},
		{ "row_major",		glu::MATRIXORDER_ROW_MAJOR		},
		{ "column_major",	glu::MATRIXORDER_COLUMN_MAJOR	},
	};

	const ProgramResourceQueryTestTarget queryTarget(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);

	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		// Add layout qualifiers only for block members
		if (qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST || parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK)
		{
			ResourceDefinition::Node::SharedPtr	subStructure	= parentStructure;
			tcu::TestCaseGroup* const			qualifierGroup	= new tcu::TestCaseGroup(context.getTestContext(), qualifiers[qualifierNdx].name, "");

			targetGroup->addChild(qualifierGroup);

			if (qualifiers[qualifierNdx].order != glu::MATRIXORDER_LAST)
			{
				glu::Layout layout;
				layout.matrixOrder = qualifiers[qualifierNdx].order;
				subStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::LayoutQualifier(subStructure, layout));
			}

			if (extendedBasicTypeCases && qualifiers[qualifierNdx].order == glu::MATRIXORDER_LAST)
			{
				// .types
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "");
					qualifierGroup->addChild(blockGroup);

					generateVariableCases(context, subStructure, blockGroup, queryTarget, 1, false);
					generateMatrixVariableCases(context, subStructure, blockGroup, queryTarget, false);
					if (opaqueCases)
						generateOpaqueTypeCases(context, subStructure, blockGroup, queryTarget, 2, false);
				}

				// .aggregates
				{
					tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "");
					qualifierGroup->addChild(blockGroup);

					generateBufferBackedVariableAggregateTypeCases(context, subStructure, blockGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
				}
			}
			else
			{
				generateBufferBackedVariableAggregateTypeCases(context, subStructure, qualifierGroup, queryTarget.interface, PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR, glu::TYPE_FLOAT_MAT3X2, "", 1);
			}
		}
	}
}